

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O0

void __thiscall SubprocessSet::SubprocessSet(SubprocessSet *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined1 local_138 [8];
  sigaction act;
  sigset_t set;
  SubprocessSet *this_local;
  
  std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::vector(&this->running_);
  std::queue<Subprocess*,std::deque<Subprocess*,std::allocator<Subprocess*>>>::
  queue<std::deque<Subprocess*,std::allocator<Subprocess*>>,void>
            ((queue<Subprocess*,std::deque<Subprocess*,std::allocator<Subprocess*>>> *)
             &this->finished_);
  sigemptyset((sigset_t *)&act.sa_restorer);
  sigaddset((sigset_t *)&act.sa_restorer,2);
  sigaddset((sigset_t *)&act.sa_restorer,0xf);
  sigaddset((sigset_t *)&act.sa_restorer,1);
  iVar1 = sigprocmask(0,(sigset_t *)&act.sa_restorer,(sigset_t *)&this->old_mask_);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Fatal("sigprocmask: %s",pcVar3);
  }
  memset(local_138,0,0x98);
  local_138 = (undefined1  [8])SetInterruptedFlag;
  iVar1 = sigaction(2,(sigaction *)local_138,(sigaction *)&this->old_int_act_);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Fatal("sigaction: %s",pcVar3);
  }
  iVar1 = sigaction(0xf,(sigaction *)local_138,(sigaction *)&this->old_term_act_);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Fatal("sigaction: %s",pcVar3);
  }
  iVar1 = sigaction(1,(sigaction *)local_138,(sigaction *)&this->old_hup_act_);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Fatal("sigaction: %s",pcVar3);
  }
  return;
}

Assistant:

SubprocessSet::SubprocessSet() {
  sigset_t set;
  sigemptyset(&set);
  sigaddset(&set, SIGINT);
  sigaddset(&set, SIGTERM);
  sigaddset(&set, SIGHUP);
  if (sigprocmask(SIG_BLOCK, &set, &old_mask_) < 0)
    Fatal("sigprocmask: %s", strerror(errno));

  struct sigaction act;
  memset(&act, 0, sizeof(act));
  act.sa_handler = SetInterruptedFlag;
  if (sigaction(SIGINT, &act, &old_int_act_) < 0)
    Fatal("sigaction: %s", strerror(errno));
  if (sigaction(SIGTERM, &act, &old_term_act_) < 0)
    Fatal("sigaction: %s", strerror(errno));
  if (sigaction(SIGHUP, &act, &old_hup_act_) < 0)
    Fatal("sigaction: %s", strerror(errno));
}